

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgets.c
# Opt level: O0

char * fgets(char *__s,int __n,FILE *__stream)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *local_48;
  int local_34;
  char *local_30;
  char *dest;
  _PDCLIB_file_t *stream_local;
  int size_local;
  char *s_local;
  
  if (__n == 0) {
    s_local = (char *)0x0;
  }
  else if (__n == 1) {
    *__s = '\0';
    s_local = __s;
  }
  else {
    mtx_lock((mtx_t *)&__stream->_IO_save_base);
    iVar3 = _PDCLIB_prepread((_PDCLIB_file_t *)__stream);
    local_30 = __s;
    stream_local._4_4_ = __n;
    if (iVar3 != -1) {
      do {
        if ((__stream->_IO_read_base == __stream->_IO_write_base) &&
           (__stream->_IO_buf_base == (char *)0x0)) {
          local_34 = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__stream);
        }
        else {
          local_34 = 0;
        }
        if (local_34 == -1) break;
        if (__stream->_IO_buf_base == (char *)0x0) {
          pcVar4 = __stream->_IO_read_base;
          __stream->_IO_read_base = pcVar4 + 1;
          cVar1 = __stream->_IO_read_ptr[(long)pcVar4];
        }
        else {
          pcVar4 = __stream->_IO_buf_base;
          __stream->_IO_buf_base = pcVar4 + -1;
          cVar1 = ((undefined1 *)((long)&__stream->_IO_buf_base + 7))[(long)pcVar4];
        }
        pcVar4 = local_30 + 1;
        *local_30 = cVar1;
        bVar2 = false;
        if (cVar1 != '\n') {
          stream_local._4_4_ = stream_local._4_4_ + -1;
          bVar2 = 0 < stream_local._4_4_;
        }
        local_30 = pcVar4;
      } while (bVar2);
    }
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
    *local_30 = '\0';
    local_48 = __s;
    if (local_30 == __s) {
      local_48 = (char *)0x0;
    }
    s_local = local_48;
  }
  return s_local;
}

Assistant:

char * fgets( char * _PDCLIB_restrict s, int size, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    char * dest = s;

    if ( size == 0 )
    {
        return NULL;
    }

    if ( size == 1 )
    {
        *s = '\0';
        return s;
    }

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) != EOF )
    {
        do
        {
            if ( _PDCLIB_CHECKBUFFER( stream ) == EOF )
            {
                /* In case of error / EOF before a character is read, this
                   will lead to a \0 be written anyway. Since the results
                   are "indeterminate" by definition, this does not hurt.
                */
                break;
            }
        }
        while ( ( ( *dest++ = _PDCLIB_GETC( stream ) ) != '\n' ) && ( --size > 0 ) );
    }

    _PDCLIB_UNLOCK( stream->mtx );

    *dest = '\0';
    return ( dest == s ) ? NULL : s;
}